

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chariterators.h
# Opt level: O1

utf16insert_iterator<std::back_insert_iterator<std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>_>
* __thiscall
utf16insert_iterator<std::back_insert_iterator<std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>_>
::operator=(utf16insert_iterator<std::back_insert_iterator<std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>_>
            *this,uint32_t x)

{
  if (x < 0x110000 && (x & 0xfffff800) != 0xd800) {
    if (0xffff < x) {
      std::__cxx11::
      basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
      ::push_back((this->_p).container,(ushort)(x + 0xff0000 >> 10) | 0xd800);
      x = x & 0x3ff | 0xdc00;
    }
    std::__cxx11::
    basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
    ::push_back((this->_p).container,(unsigned_short)x);
  }
  return this;
}

Assistant:

utf16insert_iterator& operator=(uint32_t x)
    {
        if (x>=0xd800 && x<0xe000)
            return *this;
        if (x>=0x110000)
            return *this;
        if (x<0x10000) {
            *_p++ = x;
            return *this;
        }
        x-=0x10000;
        *_p++ = 0xd800|(x>>10);
        *_p++ = 0xdc00|(x&0x3ff);
        return *this;
    }